

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel_reif(IntVar *x,IntRelType t,IntVar *y,BoolView *r,int c)

{
  IntView<0> x_00;
  FILE *__stream;
  char *pcVar1;
  IntVar *in_RCX;
  IntVar *in_RDX;
  undefined4 in_ESI;
  IntVar *in_RDI;
  int in_R8D;
  BoolView *in_stack_000001a0;
  undefined1 in_stack_000001a8 [16];
  IntView<0> in_stack_000001b8;
  BoolView *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffe08;
  int _b;
  undefined4 in_stack_fffffffffffffe0c;
  int _a;
  undefined8 in_stack_fffffffffffffe10;
  Lit p;
  undefined1 local_170 [16];
  IntView<0> local_160;
  IntView<0> local_150;
  IntView<0> local_140;
  IntView<0> local_130;
  int local_120;
  int local_11c;
  IntView<0> local_108;
  IntView<0> local_f8;
  BoolView *in_stack_ffffffffffffff20;
  IntView<0> in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  IntView<0> local_88;
  IntView<0> local_78;
  IntView<0> local_68;
  IntView<0> local_58;
  IntView<0> local_48;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  IntRelType IVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  __stream = _stderr;
  p.x = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  switch(in_ESI) {
  case 0:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffc8,in_RDI,1,0);
    IntView<0>::IntView(&local_48,in_RDX,1,in_R8D);
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    IntView<0>::IntView(&local_58,in_RDX,1,0);
    IntView<0>::IntView(&local_68,in_RDI,1,-in_R8D);
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    IntView<0>::IntView(&local_78,in_RDI,1,0);
    IntView<0>::IntView(&local_88,in_RDX,1,in_R8D);
    BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    operator~((Lit)0x276fc9);
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),p);
    x_00.var._4_4_ = in_stack_ffffffffffffff3c;
    x_00.var._0_4_ = in_stack_ffffffffffffff38;
    x_00.a = (int)in_stack_ffffffffffffff40;
    x_00.b = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    newBinNE(x_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    BoolView::~BoolView((BoolView *)0x277028);
    break;
  case 1:
    BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    IVar2 = (IntRelType)((ulong)in_RDX >> 0x20);
    operator~((Lit)0x27708d);
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),p);
    int_rel_reif((IntVar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),IVar2,in_RCX,
                 (BoolView *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4);
    BoolView::~BoolView((BoolView *)0x2770da);
    break;
  case 2:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff28,in_RDX,1,0);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff18,in_RDI,1,-in_R8D);
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    IntView<0>::IntView(&local_f8,in_RDI,1,0);
    IntView<0>::IntView(&local_108,in_RDX,1,in_R8D + 1);
    local_120 = (int)BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    local_11c = (int)operator~((Lit)0x2771d7);
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),p);
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    BoolView::~BoolView((BoolView *)0x277230);
    break;
  case 3:
    _a = 1;
    _b = 0;
    IntView<0>::IntView(&local_130,in_RDX,1,0);
    IntView<0>::IntView(&local_140,in_RDI,_a,_a - in_R8D);
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    IntView<0>::IntView(&local_150,in_RDI,_a,_b);
    IntView<0>::IntView(&local_160,in_RDX,_a,in_R8D);
    BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    operator~((Lit)0x27732d);
    BoolView::BoolView((BoolView *)CONCAT44(_a,_b),(Lit)(int)((ulong)local_170 >> 0x20));
    newBinGE(in_stack_000001b8,(IntView<0>)in_stack_000001a8,in_stack_000001a0);
    BoolView::~BoolView((BoolView *)0x277386);
    break;
  case 4:
    BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    IVar2 = (IntRelType)((ulong)in_RDX >> 0x20);
    operator~((Lit)0x2773eb);
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),p);
    int_rel_reif((IntVar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),IVar2,in_RCX,
                 (BoolView *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4);
    BoolView::~BoolView((BoolView *)0x27743b);
    break;
  case 5:
    BoolView::operator_cast_to_Lit(in_stack_fffffffffffffdc8);
    IVar2 = (IntRelType)((ulong)in_RDX >> 0x20);
    operator~((Lit)0x2774a0);
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),p);
    int_rel_reif((IntVar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),IVar2,in_RCX,
                 (BoolView *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4);
    BoolView::~BoolView((BoolView *)0x2774f0);
    break;
  default:
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                       ,0x2f);
      pcVar1 = pcVar1 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar1,0x18e);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  return;
}

Assistant:

void int_rel_reif(IntVar* x, IntRelType t, IntVar* y, const BoolView& r, int c) {
	switch (t) {
		case IRT_EQ:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinNE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_NE:
			int_rel_reif(x, IRT_EQ, y, ~r, c);
			break;
		case IRT_LE:
			// x <= y <-> r <=> y >= x <- r /\ x >= (y+1) <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c), ~r);
			break;
		case IRT_LT:
			// x < y <-> r <=> y >= (x+1) <- r /\ x >= y <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_GE:
			int_rel_reif(x, IRT_LT, y, ~r, c);
			break;
		case IRT_GT:
			int_rel_reif(x, IRT_LE, y, ~r, c);
			break;
		default:
			NEVER;
	}
}